

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fio.c
# Opt level: O0

void deferred_on_data(void *uuid,void *arg2)

{
  fio_defer_task_s task;
  int iVar1;
  int iVar2;
  fio_protocol_s *pr_00;
  int *piVar3;
  fio_protocol_s *pr;
  void *arg2_local;
  void *uuid_local;
  
  iVar1 = fio_is_closed((intptr_t)uuid);
  if (iVar1 == 0) {
    iVar1 = (int)((ulong)uuid >> 8);
    if (*(long *)((long)fio_data + (long)iVar1 * 0xa8 + 0x58) == 0) {
      deferred_on_ready(uuid,arg2);
    }
    else {
      pr_00 = protocol_try_lock((long)iVar1,FIO_PR_LOCK_TASK);
      if (pr_00 == (fio_protocol_s *)0x0) {
        piVar3 = __errno_location();
        if (*piVar3 != 9) {
          if (arg2 == (void *)0x0) {
            fio_poll_add_read((long)iVar1);
          }
          else {
            task.arg1 = uuid;
            task.func = deferred_on_data;
            task.arg2 = &DAT_00000001;
            fio_defer_push_task_fn(task,&task_queue_normal);
            fio_defer_thread_signal();
          }
        }
      }
      else {
        fio_unlock((fio_lock_i *)((long)fio_data + (long)iVar1 * 0xa8 + 0x6b));
        (*pr_00->on_data)((intptr_t)uuid,pr_00);
        protocol_unlock(pr_00,FIO_PR_LOCK_TASK);
        iVar2 = fio_trylock((fio_lock_i *)((long)fio_data + (long)iVar1 * 0xa8 + 0x6b));
        if (iVar2 == 0) {
          fio_poll_add_read((long)iVar1);
        }
      }
    }
  }
  return;
}

Assistant:

static void deferred_on_data(void *uuid, void *arg2) {
  if (fio_is_closed((intptr_t)uuid)) {
    return;
  }
  if (!uuid_data(uuid).protocol)
    goto no_protocol;
  fio_protocol_s *pr = protocol_try_lock(fio_uuid2fd(uuid), FIO_PR_LOCK_TASK);
  if (!pr) {
    if (errno == EBADF) {
      return;
    }
    goto postpone;
  }
  fio_unlock(&uuid_data(uuid).scheduled);
  pr->on_data((intptr_t)uuid, pr);
  protocol_unlock(pr, FIO_PR_LOCK_TASK);
  if (!fio_trylock(&uuid_data(uuid).scheduled)) {
    fio_poll_add_read(fio_uuid2fd((intptr_t)uuid));
  }
  return;

postpone:
  if (arg2) {
    /* the event is being forced, so force rescheduling */
    fio_defer_push_task(deferred_on_data, (void *)uuid, (void *)1);
  } else {
    /* the protocol was locked, so there might not be any need for the event */
    fio_poll_add_read(fio_uuid2fd((intptr_t)uuid));
  }
  return;

no_protocol:
  /* a missing protocol might still want to invoke the RW hook flush */
  deferred_on_ready(uuid, arg2);
  return;
}